

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O1

string * __thiscall
cmFindPathCommand::FindHeader_abi_cxx11_(string *__return_storage_ptr__,cmFindPathCommand *this)

{
  pointer pcVar1;
  cmFindBaseDebugState debug;
  string local_e0;
  string local_c0;
  cmFindBaseDebugState local_a0;
  
  pcVar1 = (this->super_cmFindBase).FindCommandName._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,
             pcVar1 + (this->super_cmFindBase).FindCommandName._M_string_length);
  cmFindBaseDebugState::cmFindBaseDebugState(&local_a0,&local_c0,&this->super_cmFindBase);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkFirst != false) ||
     ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly == true)) {
    FindFrameworkHeader_abi_cxx11_(&local_e0,this,&local_a0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((__return_storage_ptr__->_M_string_length == 0) &&
     ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkOnly == false)) {
    FindNormalHeader_abi_cxx11_(&local_e0,this,&local_a0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((__return_storage_ptr__->_M_string_length == 0) &&
     ((this->super_cmFindBase).super_cmFindCommon.SearchFrameworkLast == true)) {
    FindFrameworkHeader_abi_cxx11_(&local_e0,this,&local_a0);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  cmFindBaseDebugState::~cmFindBaseDebugState(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindPathCommand::FindHeader()
{
  cmFindBaseDebugState debug(this->FindCommandName, this);
  std::string header;
  if (this->SearchFrameworkFirst || this->SearchFrameworkOnly) {
    header = this->FindFrameworkHeader(debug);
  }
  if (header.empty() && !this->SearchFrameworkOnly) {
    header = this->FindNormalHeader(debug);
  }
  if (header.empty() && this->SearchFrameworkLast) {
    header = this->FindFrameworkHeader(debug);
  }

  return header;
}